

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey.h
# Opt level: O2

char llbuild::buildsystem::BuildKey::identifierForKind(Kind kind)

{
  return "CXDdSsNIT "[(int)kind];
}

Assistant:

static char identifierForKind(Kind kind) {
    switch (kind) {
    case Kind::Command: return 'C';
    case Kind::DirectoryContents: return 'D';
    case Kind::FilteredDirectoryContents: return 'd';
    case Kind::Node: return 'N';
    case Kind::Stat: return 'I';
    case Kind::DirectoryTreeSignature: return 'S';
    case Kind::DirectoryTreeStructureSignature: return 's';
    case Kind::Target: return 'T';
    case Kind::CustomTask: return 'X';
    case Kind::Unknown: return ' ';
    }
  }